

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.h
# Opt level: O2

char * __thiscall Memory::ArenaAllocator::AllocZero(ArenaAllocator *this,size_t nbytes)

{
  char *__s;
  
  __s = ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                  (&this->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                   nbytes);
  memset(__s,0,nbytes);
  memset(__s + nbytes,0,(nbytes + 0xf & 0xfffffffffffffff0) - nbytes);
  return __s;
}

Assistant:

char * AllocZero(DECLSPEC_GUARD_OVERFLOW size_t nbytes)
    {
        char * buffer = Alloc(nbytes);
        memset(buffer, 0, nbytes);
#if DBG
        // Since we successfully allocated, we shouldn't have integer overflow here
        memset(buffer + nbytes, 0, Math::Align(nbytes, ArenaAllocatorBase::ObjectAlignment) - nbytes);
#endif
        return buffer;
    }